

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

void __thiscall
GraphViewer::initialize(GraphViewer *this,int width,int height,bool dynamic,int port_n)

{
  __pid_t __pid;
  Connection *pCVar1;
  char *pcVar2;
  allocator local_301;
  string command;
  string local_2e0;
  string str;
  string port_string;
  stringstream ss;
  ostream local_270 [376];
  char buff [200];
  
  this->width = width;
  this->height = height;
  this->isDynamic = dynamic;
  std::__cxx11::string::string
            ((string *)&command,"java -jar ../src/GraphViewer/GraphViewerController.jar",
             (allocator *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::operator<<(local_270,port_n);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((char *)&command);
  std::__cxx11::string::append((string *)&command);
  procId = fork();
  if (procId != 0) {
    usleep(2000000);
    pCVar1 = (Connection *)operator_new(4);
    Connection::Connection(pCVar1,(short)port_n);
    this->con = pCVar1;
    pcVar2 = "false";
    if (dynamic) {
      pcVar2 = "true";
    }
    sprintf(buff,"newGraph %d %d %s\n",(ulong)(uint)width,(ulong)(uint)height,pcVar2);
    std::__cxx11::string::string((string *)&str,buff,&local_301);
    pCVar1 = this->con;
    std::__cxx11::string::string((string *)&local_2e0,(string *)&str);
    Connection::sendMsg(pCVar1,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::string::~string((string *)&port_string);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&command);
    return;
  }
  system(command._M_dataplus._M_p);
  __pid = getppid();
  kill(__pid,2);
  exit(0);
}

Assistant:

void GraphViewer::initialize(int width, int height, bool dynamic, int port_n) {
	this->width = width;
	this->height = height;
	this->isDynamic = dynamic;
	string command = "java -jar ../src/GraphViewer/GraphViewerController.jar";
	std::stringstream ss;
	ss << port_n;
	string port_string = ss.str();
	command += " --port ";
	command += port_string;

#if defined(__linux__) || defined(__APPLE__)
	if (!(procId = fork())) {
		system(command.c_str());
		kill(getppid(), SIGINT);
		exit(0);
	}
	else {
		usleep(2000000);
		con = new Connection(port_n);

		char buff[200];
		sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
		string str(buff);
		con->sendMsg(str);
	}
#else
	STARTUPINFO si;
	PROCESS_INFORMATION pi;
	ZeroMemory( &si, sizeof(si) );
	si.cb = sizeof(si);
	ZeroMemory( &pi, sizeof(pi) );
	LPSTR command_lpstr = const_cast<char *>(command.c_str());
	if( !CreateProcess( NULL,   // No module name (use command line)
			command_lpstr,        // Command line
			NULL,           // Process handle not inheritable
			NULL,           // Thread handle not inheritable
			FALSE,          // Set handle inheritance to FALSE
			0,              // No creation flags
			NULL,           // Use parent's environment block
			NULL,           // Use parent's starting directory
			&si,            // Pointer to STARTUPINFO structure
			&pi )           // Pointer to PROCESS_INFORMATION structure
	) {
		cerr << "CreateProcess failed " << GetLastError() << endl;
		return;
	}

	// Close process and thread handles.
	CloseHandle( pi.hProcess );
	CloseHandle( pi.hThread );

	Sleep(2000);
	con = new Connection(port_n);

	char buff[200];
	sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
	string str(buff);
	con->sendMsg(str);
#endif

}